

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_titlecase_brkiter.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::toTitle
          (UnicodeString *this,BreakIterator *iter,Locale *locale,uint32_t options)

{
  int32_t caseLocale;
  BreakIterator *iter_00;
  char *locale_00;
  LocalPointer<icu_63::BreakIterator> ownedIter;
  UErrorCode errorCode;
  LocalPointerBase<icu_63::BreakIterator> local_30;
  UErrorCode local_24;
  
  local_30.ptr = (BreakIterator *)0x0;
  local_24 = U_ZERO_ERROR;
  iter_00 = ustrcase_getTitleBreakIterator_63
                      (locale,"",options,iter,(LocalPointer<icu_63::BreakIterator> *)&local_30,
                       &local_24);
  if (iter_00 == (BreakIterator *)0x0) {
    setToBogus(this);
  }
  else {
    locale_00 = Locale::getBaseName(locale);
    caseLocale = ustrcase_getCaseLocale_63(locale_00);
    caseMap(this,caseLocale,options,iter_00,ustrcase_internalToTitle_63);
  }
  if (local_30.ptr != (BreakIterator *)0x0) {
    (*((local_30.ptr)->super_UObject)._vptr_UObject[1])();
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::toTitle(BreakIterator *iter, const Locale &locale, uint32_t options) {
    LocalPointer<BreakIterator> ownedIter;
    UErrorCode errorCode = U_ZERO_ERROR;
    iter = ustrcase_getTitleBreakIterator(&locale, "", options, iter, ownedIter, errorCode);
    if (iter == nullptr) {
        setToBogus();
        return *this;
    }
    caseMap(ustrcase_getCaseLocale(locale.getBaseName()), options, iter, ustrcase_internalToTitle);
    return *this;
}